

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool cmCTest::ProgressOutputSupportedByConsole(void)

{
  bool bVar1;
  int iVar2;
  string sStack_28;
  
  sStack_28._M_dataplus._M_p = (pointer)&sStack_28.field_2;
  sStack_28._M_string_length = 0;
  sStack_28.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv("TERM",&sStack_28);
  if (bVar1) {
    iVar2 = isatty(1);
    if (iVar2 != 0) {
      bVar1 = std::operator!=(&sStack_28,"dumb");
      goto LAB_0044d964;
    }
  }
  bVar1 = false;
LAB_0044d964:
  std::__cxx11::string::~string((string *)&sStack_28);
  return bVar1;
}

Assistant:

bool cmCTest::ProgressOutputSupportedByConsole()
{
#if defined(_WIN32)
  // On Windows we need a console buffer.
  void* console = GetStdHandle(STD_OUTPUT_HANDLE);
  CONSOLE_SCREEN_BUFFER_INFO csbi;
  return GetConsoleScreenBufferInfo(console, &csbi);
#else
  // On UNIX we need a non-dumb tty.
  return ConsoleIsNotDumb();
#endif
}